

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O2

void prepare_vertical_filter_coeffs_gamma0_avx2(int delta,int sy,__m256i *coeffs)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  
  auVar5._16_16_ = (undefined1  [16])av1_warped_filter[delta + sy >> 10];
  auVar5._0_16_ = (undefined1  [16])av1_warped_filter[sy >> 10];
  alVar1 = (__m256i)vshufps_avx(auVar5,auVar5,0);
  *coeffs = alVar1;
  alVar2 = (__m256i)vshufps_avx(auVar5,auVar5,0x55);
  coeffs[1] = alVar2;
  alVar3 = (__m256i)vshufps_avx(auVar5,auVar5,0xaa);
  coeffs[2] = alVar3;
  alVar4 = (__m256i)vshufps_avx(auVar5,auVar5,0xff);
  coeffs[3] = alVar4;
  coeffs[4] = alVar1;
  coeffs[5] = alVar2;
  coeffs[6] = alVar3;
  coeffs[7] = alVar4;
  return;
}

Assistant:

static inline void prepare_vertical_filter_coeffs_gamma0_avx2(int delta, int sy,
                                                              __m256i *coeffs) {
  const __m128i filt_0 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter + (sy >> WARPEDDIFF_PREC_BITS)));
  const __m128i filt_1 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter + ((sy + delta) >> WARPEDDIFF_PREC_BITS)));

  __m256i res_0 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(filt_0), filt_1, 0x1);

  coeffs[0] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_gamma0_mask0_avx2));
  coeffs[1] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_gamma0_mask1_avx2));
  coeffs[2] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_gamma0_mask2_avx2));
  coeffs[3] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_gamma0_mask3_avx2));

  coeffs[4] = coeffs[0];
  coeffs[5] = coeffs[1];
  coeffs[6] = coeffs[2];
  coeffs[7] = coeffs[3];
}